

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O2

string * istr_abi_cxx11_(string *__return_storage_ptr__,int b)

{
  string sStack_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&sStack_38);
  if (b == 0x7fffffff) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::to_string(&sStack_38,b);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string istr(int b) {
  std::string result = "";
  if (b == minf) {
    result = "-inf";
  } else if (b == pinf) {
    result = "+inf"; 
  } else {
    result = std::to_string(b);
  }
  return result;
}